

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::DoOffset(ClipperOffset *this,double delta)

{
  Paths *this_00;
  pointer *ppIVar1;
  pointer *ppDVar2;
  int iVar3;
  pointer pIVar4;
  pointer pDVar5;
  IntPoint *pt2;
  undefined1 auVar6 [16];
  EndType EVar7;
  pointer ppPVar8;
  double *pdVar9;
  pointer ppPVar10;
  pointer pDVar11;
  int iVar12;
  ulong uVar13;
  iterator iVar14;
  iterator iVar15;
  Path *this_01;
  ulong uVar16;
  uint j;
  int iVar17;
  long lVar18;
  ulong uVar19;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *pvVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [8];
  ulong in_XMM0_Qb;
  double dVar25;
  undefined8 uVar26;
  PolyNode *pPVar27;
  PolyNode *pPVar28;
  double dVar29;
  int k;
  undefined1 local_c8 [8];
  double dStack_c0;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *local_b8;
  uint local_ac;
  PolyNode *local_a8;
  double dStack_a0;
  Path *local_90;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_88;
  Paths *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  ulong local_38;
  
  this_00 = &this->m_destPolys;
  local_48 = delta;
  uStack_40 = in_XMM0_Qb;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::_M_erase_at_end(this_00,(this->m_destPolys).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  this->m_delta = local_48;
  local_58 = ABS(local_48);
  uStack_50 = uStack_40 & 0x7fffffffffffffff;
  if (1e-20 <= local_58) {
    dVar22 = this->MiterLimit;
    dVar29 = this->ArcTolerance;
    this->m_miterLim =
         (double)(~-(ulong)(2.0 < dVar22) & 0x3fe0000000000000 |
                 (ulong)(2.0 / (dVar22 * dVar22)) & -(ulong)(2.0 < dVar22));
    if (dVar29 <= 0.0) {
      dVar22 = 0.25;
    }
    else {
      dVar22 = local_58 * 0.25;
      if (dVar29 <= local_58 * 0.25) {
        dVar22 = dVar29;
      }
    }
    dVar22 = acos(1.0 - dVar22 / local_58);
    local_58 = local_58 * 3.141592653589793;
    if (3.141592653589793 / dVar22 <= local_58) {
      local_58 = 3.141592653589793 / dVar22;
    }
    local_a8 = (PolyNode *)(6.283185307179586 / local_58);
    dVar22 = sin((double)local_a8);
    this->m_sin = dVar22;
    dVar22 = cos((double)local_a8);
    this->m_cos = dVar22;
    this->m_StepsPerRad = local_58 / 6.283185307179586;
    if (local_48 < 0.0) {
      this->m_sin = -this->m_sin;
    }
    local_80 = this_00;
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_00,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) &
                      0xfffffffffffffffe);
    ppPVar8 = (this->m_polyNodes).Childs.
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar8) >> 3)) {
      this_01 = &this->m_srcPoly;
      local_b8 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                 &this->m_destPoly;
      local_88 = &this->m_normals;
      local_68 = local_48;
      dStack_60 = local_48;
      dVar22 = 0.0;
      local_90 = this_01;
      do {
        local_a8 = ppPVar8[(long)dVar22];
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                  (this_01,&local_a8->Contour);
        pvVar20 = local_b8;
        uVar19 = (long)(this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = uVar19 >> 4;
        iVar12 = (int)uVar13;
        if ((iVar12 != 0) &&
           ((0.0 < local_48 || ((2 < iVar12 && (local_a8->m_endtype == etClosedPolygon)))))) {
          pIVar4 = (this->m_destPoly).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->m_destPoly).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
            (this->m_destPoly).
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish = pIVar4;
          }
          if (iVar12 == 1) {
            if (local_a8->m_jointype == jtRound) {
              if (1.0 <= local_58) {
                lVar18 = 2;
                pPVar27 = (PolyNode *)0x3ff0000000000000;
                dVar29 = 0.0;
                do {
                  pIVar4 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar23 = (double)pPVar27 * local_68 + (double)pIVar4->X;
                  dVar25 = dVar29 * dStack_60 + (double)pIVar4->Y;
                  uVar13 = -(ulong)(dVar23 < 0.0);
                  uVar19 = -(ulong)(dVar25 < 0.0);
                  local_c8 = (undefined1  [8])
                             (long)((double)(uVar13 & 0xbfe0000000000000 |
                                            ~uVar13 & 0x3fe0000000000000) + dVar23);
                  dStack_c0 = (double)(long)((double)(uVar19 & 0xbfe0000000000000 |
                                                     ~uVar19 & 0x3fe0000000000000) + dVar25);
                  iVar15._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar15._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    local_a8 = pPVar27;
                    dStack_a0 = dVar29;
                    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    _M_realloc_insert<ClipperLib::IntPoint>
                              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                *)pvVar20,iVar15,(IntPoint *)local_c8);
                    pPVar28 = local_a8;
                    dVar29 = dStack_a0;
                  }
                  else {
                    (iVar15._M_current)->X = (cInt)local_c8;
                    (iVar15._M_current)->Y = (cInt)dStack_c0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                    pPVar28 = pPVar27;
                  }
                  dVar23 = (double)lVar18;
                  pPVar27 = (PolyNode *)((double)pPVar28 * this->m_cos + -this->m_sin * dVar29);
                  dVar29 = (double)pPVar28 * this->m_sin + this->m_cos * dVar29;
                  lVar18 = lVar18 + 1;
                } while (dVar23 <= local_58);
              }
            }
            else {
              iVar12 = 4;
              dVar29 = -1.0;
              uVar26 = 0;
              pPVar27 = (PolyNode *)0xbff0000000000000;
              do {
                pIVar4 = (this->m_srcPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar23 = (double)pPVar27 * local_48 + (double)pIVar4->X;
                uVar13 = -(ulong)(dVar23 < 0.0);
                local_c8 = (undefined1  [8])
                           (long)((double)(~uVar13 & 0x3fe0000000000000 |
                                          uVar13 & 0xbfe0000000000000) + dVar23);
                dVar23 = dVar29 * local_48 + (double)pIVar4->Y;
                uVar13 = -(ulong)(dVar23 < 0.0);
                dStack_c0 = (double)(long)((double)(~uVar13 & 0x3fe0000000000000 |
                                                   uVar13 & 0xbfe0000000000000) + dVar23);
                iVar15._M_current =
                     (this->m_destPoly).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar15._M_current ==
                    (this->m_destPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_a8 = pPVar27;
                  local_78 = dVar29;
                  uStack_70 = uVar26;
                  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                  _M_realloc_insert<ClipperLib::IntPoint>
                            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                             pvVar20,iVar15,(IntPoint *)local_c8);
                  pPVar27 = local_a8;
                  dVar29 = local_78;
                  uVar26 = uStack_70;
                }
                else {
                  (iVar15._M_current)->X = (cInt)local_c8;
                  (iVar15._M_current)->Y = (cInt)dStack_c0;
                  ppIVar1 = &(this->m_destPoly).
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + 1;
                }
                if (0.0 <= (double)pPVar27) {
                  if (0.0 <= dVar29) {
                    pPVar27 = (PolyNode *)0xbff0000000000000;
                  }
                  dVar29 = (double)(~-(ulong)(dVar29 < 0.0) & (ulong)dVar29 |
                                   -(ulong)(dVar29 < 0.0) & 0x3ff0000000000000);
                  uVar26 = 0;
                }
                else {
                  pPVar27 = (PolyNode *)0x3ff0000000000000;
                }
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
LAB_001153ae:
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(local_80,(value_type *)pvVar20);
          }
          else {
            pDVar5 = (this->m_normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_normals).
                super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                ._M_impl.super__Vector_impl_data._M_finish != pDVar5) {
              (this->m_normals).
              super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = pDVar5;
            }
            local_78 = dVar22;
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::reserve
                      (local_88,(long)iVar12);
            j = iVar12 - 1;
            if (1 < iVar12) {
              uVar16 = (ulong)j;
              lVar18 = 0;
              do {
                pIVar4 = (this->m_srcPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                _local_c8 = GetUnitNormal((IntPoint *)((long)&pIVar4->X + lVar18),
                                          (IntPoint *)((long)&pIVar4[1].X + lVar18));
                iVar14._M_current =
                     (this->m_normals).
                     super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (this->m_normals).
                    super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                  _M_realloc_insert<ClipperLib::DoublePoint>
                            (local_88,iVar14,(DoublePoint *)local_c8);
                }
                else {
                  (iVar14._M_current)->X = (double)local_c8;
                  (iVar14._M_current)->Y = dStack_c0;
                  ppDVar2 = &(this->m_normals).
                             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppDVar2 = *ppDVar2 + 1;
                }
                lVar18 = lVar18 + 0x10;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
            if (local_a8->m_endtype < etOpenButt) {
              pt2 = (this->m_srcPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              _local_c8 = GetUnitNormal(pt2 + (int)j,pt2);
              iVar14._M_current =
                   (this->m_normals).
                   super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar14._M_current ==
                  (this->m_normals).
                  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00114e3d;
              auVar24 = local_c8;
              dVar22 = dStack_c0;
LAB_00114e32:
              (iVar14._M_current)->X = (double)auVar24;
              (iVar14._M_current)->Y = dVar22;
              ppDVar2 = &(this->m_normals).
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppDVar2 = *ppDVar2 + 1;
            }
            else {
              pDVar5 = (this->m_normals).
                       super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar18 = (long)(uVar19 * 0x10000000 + -0x200000000) >> 0x1c;
              _local_c8 = *(DoublePoint *)((long)&pDVar5->X + lVar18);
              iVar14._M_current =
                   (this->m_normals).
                   super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar14._M_current !=
                  (this->m_normals).
                  super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                pdVar9 = (double *)((long)&pDVar5->X + lVar18);
                auVar24 = (undefined1  [8])*pdVar9;
                dVar22 = pdVar9[1];
                goto LAB_00114e32;
              }
LAB_00114e3d:
              std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
              _M_realloc_insert<ClipperLib::DoublePoint>(local_88,iVar14,(DoublePoint *)local_c8);
            }
            pPVar27 = local_a8;
            pvVar20 = local_b8;
            EVar7 = local_a8->m_endtype;
            if (EVar7 == etClosedLine) {
              local_c8._0_4_ = j;
              if (0 < iVar12) {
                iVar17 = 0;
                do {
                  OffsetPoint(this,iVar17,(int *)local_c8,pPVar27->m_jointype);
                  iVar17 = iVar17 + 1;
                } while (iVar12 != iVar17);
              }
              pvVar20 = local_b8;
              std::
              vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ::push_back(local_80,(value_type *)local_b8);
              pPVar27 = local_a8;
              pIVar4 = (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->m_destPoly).
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
                (this->m_destPoly).
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish = pIVar4;
              }
              pDVar5 = (local_88->
                       super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              dVar22 = pDVar5[(int)j].X;
              dVar29 = pDVar5[(int)j].Y;
              if (1 < iVar12) {
                uVar13 = (ulong)j + 1;
                pDVar11 = pDVar5 + j;
                do {
                  dVar23 = pDVar11[-1].Y;
                  pDVar11->X = -pDVar11[-1].X;
                  pDVar11->Y = -dVar23;
                  pDVar11 = pDVar11 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              pDVar5->X = -dVar22;
              pDVar5->Y = -dVar29;
              auVar6._12_4_ = 0;
              auVar6._0_12_ = stack0xffffffffffffff3c;
              _local_c8 = (DoublePoint)(auVar6 << 0x20);
              if (0 < iVar12) {
                do {
                  OffsetPoint(this,j,(int *)local_c8,pPVar27->m_jointype);
                  bVar21 = j != 0;
                  j = j - 1;
                } while (bVar21);
              }
            }
            else {
              if (EVar7 != etClosedPolygon) {
                local_ac = 0;
                if (2 < iVar12) {
                  iVar17 = 1;
                  local_38 = uVar13;
                  do {
                    OffsetPoint(this,iVar17,(int *)&local_ac,pPVar27->m_jointype);
                    iVar3 = iVar17 - iVar12;
                    iVar17 = iVar17 + 1;
                  } while (iVar3 != -2);
                  EVar7 = pPVar27->m_endtype;
                  uVar13 = local_38;
                }
                _local_c8 = (DoublePoint)ZEXT816(0);
                iVar12 = (int)uVar13;
                if (EVar7 == etOpenButt) {
                  pIVar4 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar5 = (this->m_normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)j;
                  dVar22 = pDVar5->X * local_68 + (double)pIVar4[(int)j].X;
                  dVar29 = pDVar5->Y * dStack_60 + (double)pIVar4[(int)j].Y;
                  uVar13 = -(ulong)(dVar22 < 0.0);
                  uVar19 = -(ulong)(dVar29 < 0.0);
                  local_c8 = (undefined1  [8])
                             (long)((double)(uVar13 & 0xbfe0000000000000 |
                                            ~uVar13 & 0x3fe0000000000000) + dVar22);
                  dStack_c0 = (double)(long)((double)(uVar19 & 0xbfe0000000000000 |
                                                     ~uVar19 & 0x3fe0000000000000) + dVar29);
                  iVar15._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar15._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (local_b8,iVar15,(IntPoint *)local_c8);
                    iVar15._M_current =
                         (this->m_destPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar15._M_current)->X = (cInt)local_c8;
                    (iVar15._M_current)->Y = (cInt)dStack_c0;
                    iVar15._M_current =
                         (this->m_destPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    (this->m_destPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current;
                  }
                  pvVar20 = local_b8;
                  pIVar4 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar5 = (this->m_normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)j;
                  dVar22 = (double)pIVar4[(int)j].X - pDVar5->X * local_68;
                  dVar29 = (double)pIVar4[(int)j].Y - pDVar5->Y * dStack_60;
                  uVar13 = -(ulong)(dVar22 < 0.0);
                  uVar19 = -(ulong)(dVar29 < 0.0);
                  local_c8 = (undefined1  [8])
                             (long)((double)(uVar13 & 0xbfe0000000000000 |
                                            ~uVar13 & 0x3fe0000000000000) + dVar22);
                  dStack_c0 = (double)(long)((double)(uVar19 & 0xbfe0000000000000 |
                                                     ~uVar19 & 0x3fe0000000000000) + dVar29);
                  if (iVar15._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (local_b8,iVar15,(IntPoint *)local_c8);
                  }
                  else {
                    (iVar15._M_current)->X = (cInt)local_c8;
                    (iVar15._M_current)->Y = (cInt)dStack_c0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                else {
                  local_ac = iVar12 - 2;
                  this->m_sinA = 0.0;
                  pDVar11 = (this->m_normals).
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pDVar5 = pDVar11 + (int)j;
                  dVar22 = pDVar5->Y;
                  pDVar11 = pDVar11 + (int)j;
                  pDVar11->X = -pDVar5->X;
                  pDVar11->Y = -dVar22;
                  if (EVar7 == etOpenSquare) {
                    DoSquare(this,j,local_ac);
                    pvVar20 = local_b8;
                  }
                  else {
                    DoRound(this,j,local_ac);
                    pvVar20 = local_b8;
                  }
                }
                pPVar27 = local_a8;
                pDVar5 = (local_88->
                         super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (1 < iVar12) {
                  uVar13 = (ulong)j + 1;
                  pDVar11 = pDVar5 + j;
                  do {
                    dVar22 = pDVar11[-1].Y;
                    pDVar11->X = -pDVar11[-1].X;
                    pDVar11->Y = -dVar22;
                    pDVar11 = pDVar11 + -1;
                    uVar13 = uVar13 - 1;
                  } while (1 < uVar13);
                }
                dVar22 = pDVar5[1].Y;
                pDVar5->X = -pDVar5[1].X;
                pDVar5->Y = -dVar22;
                local_ac = j;
                if (2 < iVar12) {
                  do {
                    j = j - 1;
                    OffsetPoint(this,j,(int *)&local_ac,pPVar27->m_jointype);
                  } while (1 < j);
                }
                dVar22 = local_78;
                EVar7 = pPVar27->m_endtype;
                if (EVar7 == etOpenButt) {
                  pIVar4 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar5 = (this->m_normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar29 = (double)pIVar4->X - pDVar5->X * local_68;
                  dVar23 = (double)pIVar4->Y - pDVar5->Y * dStack_60;
                  uVar13 = -(ulong)(dVar29 < 0.0);
                  uVar19 = -(ulong)(dVar23 < 0.0);
                  local_c8 = (undefined1  [8])
                             (long)((double)(uVar13 & 0xbfe0000000000000 |
                                            ~uVar13 & 0x3fe0000000000000) + dVar29);
                  dStack_c0 = (double)(long)((double)(uVar19 & 0xbfe0000000000000 |
                                                     ~uVar19 & 0x3fe0000000000000) + dVar23);
                  iVar15._M_current =
                       (this->m_destPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar15._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (pvVar20,iVar15,(IntPoint *)local_c8);
                    iVar15._M_current =
                         (this->m_destPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (iVar15._M_current)->X = (cInt)local_c8;
                    (iVar15._M_current)->Y = (cInt)dStack_c0;
                    iVar15._M_current =
                         (this->m_destPoly).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    (this->m_destPoly).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current;
                  }
                  this_01 = local_90;
                  pIVar4 = (this->m_srcPoly).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pDVar5 = (this->m_normals).
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar29 = pDVar5->X * local_68 + (double)pIVar4->X;
                  dVar23 = pDVar5->Y * dStack_60 + (double)pIVar4->Y;
                  uVar13 = -(ulong)(dVar29 < 0.0);
                  uVar19 = -(ulong)(dVar23 < 0.0);
                  local_c8 = (undefined1  [8])
                             (long)((double)(uVar13 & 0xbfe0000000000000 |
                                            ~uVar13 & 0x3fe0000000000000) + dVar29);
                  dStack_c0 = (double)(long)((double)(uVar19 & 0xbfe0000000000000 |
                                                     ~uVar19 & 0x3fe0000000000000) + dVar23);
                  if (iVar15._M_current ==
                      (this->m_destPoly).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                    _M_realloc_insert<ClipperLib::IntPoint_const&>
                              (pvVar20,iVar15,(IntPoint *)local_c8);
                  }
                  else {
                    (iVar15._M_current)->X = (cInt)local_c8;
                    (iVar15._M_current)->Y = (cInt)dStack_c0;
                    ppIVar1 = &(this->m_destPoly).
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                }
                else {
                  this->m_sinA = 0.0;
                  if (EVar7 == etOpenSquare) {
                    DoSquare(this,0,1);
                    this_01 = local_90;
                  }
                  else {
                    DoRound(this,0,1);
                    this_01 = local_90;
                  }
                }
                goto LAB_001153ae;
              }
              local_c8._0_4_ = j;
              if (0 < iVar12) {
                iVar17 = 0;
                do {
                  OffsetPoint(this,iVar17,(int *)local_c8,pPVar27->m_jointype);
                  iVar17 = iVar17 + 1;
                } while (iVar12 != iVar17);
              }
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(local_80,(value_type *)pvVar20);
            this_01 = local_90;
            dVar22 = local_78;
          }
        }
        dVar22 = (double)((long)dVar22 + 1);
        ppPVar8 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)dVar22 <
               (long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                         super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar8)
                          >> 3));
    }
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_00,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    ppPVar8 = (this->m_polyNodes).Childs.
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppPVar10 = (this->m_polyNodes).Childs.
               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppPVar10 - (long)ppPVar8) >> 3)) {
      lVar18 = 0;
      do {
        if (ppPVar8[lVar18]->m_endtype == etClosedPolygon) {
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(this_00,&ppPVar8[lVar18]->Contour);
          ppPVar8 = (this->m_polyNodes).Childs.
                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppPVar10 = (this->m_polyNodes).Childs.
                     super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)((ulong)((long)ppPVar10 - (long)ppPVar8) >> 3));
    }
  }
  return;
}

Assistant:

void ClipperOffset::DoOffset(double delta)
{
  m_destPolys.clear();
  m_delta = delta;

  //if Zero offset, just copy any CLOSED polygons to m_p and return ...
  if (NEAR_ZERO(delta)) 
  {
    m_destPolys.reserve(m_polyNodes.ChildCount());
    for (int i = 0; i < m_polyNodes.ChildCount(); i++)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon)
        m_destPolys.push_back(node.Contour);
    }
    return;
  }

  //see offset_triginometry3.svg in the documentation folder ...
  if (MiterLimit > 2) m_miterLim = 2/(MiterLimit * MiterLimit);
  else m_miterLim = 0.5;

  double y;
  if (ArcTolerance <= 0.0) y = def_arc_tolerance;
  else if (ArcTolerance > std::fabs(delta) * def_arc_tolerance) 
    y = std::fabs(delta) * def_arc_tolerance;
  else y = ArcTolerance;
  //see offset_triginometry2.svg in the documentation folder ...
  double steps = pi / std::acos(1 - y / std::fabs(delta));
  if (steps > std::fabs(delta) * pi) 
    steps = std::fabs(delta) * pi;  //ie excessive precision check
  m_sin = std::sin(two_pi / steps);
  m_cos = std::cos(two_pi / steps);
  m_StepsPerRad = steps / two_pi;
  if (delta < 0.0) m_sin = -m_sin;

  m_destPolys.reserve(m_polyNodes.ChildCount() * 2);
  for (int i = 0; i < m_polyNodes.ChildCount(); i++)
  {
    PolyNode& node = *m_polyNodes.Childs[i];
    m_srcPoly = node.Contour;

    int len = (int)m_srcPoly.size();
    if (len == 0 || (delta <= 0 && (len < 3 || node.m_endtype != etClosedPolygon)))
        continue;

    m_destPoly.clear();
    if (len == 1)
    {
      if (node.m_jointype == jtRound)
      {
        double X = 1.0, Y = 0.0;
        for (cInt j = 1; j <= steps; j++)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          double X2 = X;
          X = X * m_cos - m_sin * Y;
          Y = X2 * m_sin + Y * m_cos;
        }
      }
      else
      {
        double X = -1.0, Y = -1.0;
        for (int j = 0; j < 4; ++j)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          if (X < 0) X = 1;
          else if (Y < 0) Y = 1;
          else X = -1;
        }
      }
      m_destPolys.push_back(m_destPoly);
      continue;
    }
    //build m_normals ...
    m_normals.clear();
    m_normals.reserve(len);
    for (int j = 0; j < len - 1; ++j)
      m_normals.push_back(GetUnitNormal(m_srcPoly[j], m_srcPoly[j + 1]));
    if (node.m_endtype == etClosedLine || node.m_endtype == etClosedPolygon)
      m_normals.push_back(GetUnitNormal(m_srcPoly[len - 1], m_srcPoly[0]));
    else
      m_normals.push_back(DoublePoint(m_normals[len - 2]));

    if (node.m_endtype == etClosedPolygon)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else if (node.m_endtype == etClosedLine)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
      m_destPoly.clear();
      //re-build m_normals ...
      DoublePoint n = m_normals[len -1];
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-n.X, -n.Y);
      k = 0;
      for (int j = len - 1; j >= 0; j--)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else
    {
      int k = 0;
      for (int j = 1; j < len - 1; ++j)
        OffsetPoint(j, k, node.m_jointype);

      IntPoint pt1;
      if (node.m_endtype == etOpenButt)
      {
        int j = len - 1;
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X + m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y + m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X - m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y - m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        int j = len - 1;
        k = len - 2;
        m_sinA = 0;
        m_normals[j] = DoublePoint(-m_normals[j].X, -m_normals[j].Y);
        if (node.m_endtype == etOpenSquare)
          DoSquare(j, k);
        else
          DoRound(j, k);
      }

      //re-build m_normals ...
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-m_normals[1].X, -m_normals[1].Y);

      k = len - 1;
      for (int j = k - 1; j > 0; --j) OffsetPoint(j, k, node.m_jointype);

      if (node.m_endtype == etOpenButt)
      {
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X - m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y - m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X + m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y + m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        k = 1;
        m_sinA = 0;
        if (node.m_endtype == etOpenSquare)
          DoSquare(0, 1);
        else
          DoRound(0, 1);
      }
      m_destPolys.push_back(m_destPoly);
    }
  }
}